

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall cmDebugger_impl::cmDebugger_impl(cmDebugger_impl *this,cmake *cmakeInstance)

{
  cmake *cmakeInstance_local;
  cmDebugger_impl *this_local;
  
  cmDebugger::cmDebugger(&this->super_cmDebugger);
  (this->super_cmDebugger)._vptr_cmDebugger = (_func_int **)&PTR_GetBacktrace_00cc0d78;
  this->CMakeInstance = cmakeInstance;
  std::atomic<cmDebugger::State::t>::atomic(&this->state,Unknown);
  std::recursive_timed_mutex::recursive_timed_mutex(&this->m);
  std::_V2::condition_variable_any::condition_variable_any(&this->cv);
  std::unique_lock<std::recursive_timed_mutex>::unique_lock(&this->Lock,&this->m);
  std::atomic<bool>::atomic(&this->breakPending,true);
  std::atomic<bool>::atomic(&this->continuePending,false);
  std::mutex::mutex(&this->breakpointMutex);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::vector(&this->breakpoints);
  this->breakDepth = -1;
  std::
  set<cmDebuggerListener_*,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  ::set(&this->listeners);
  cmListFileContext::cmListFileContext(&this->currentLocation);
  this->BreakOnError = true;
  std::
  map<unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
  ::map(&this->activeWatchpoints);
  this->nextBreakId = 1;
  return;
}

Assistant:

cmDebugger_impl(cmake& cmakeInstance)
    : CMakeInstance(cmakeInstance)
    , Lock(m)
  {
  }